

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

size_t __thiscall
Fossilize::ConcurrentDatabase::compute_exported_metadata_size(ConcurrentDatabase *this)

{
  DatabaseInterface *pDVar1;
  pointer puVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> *e;
  pointer puVar6;
  
  if (this->mode == ReadOnly) {
    sVar4 = get_total_num_hashes(this);
    pDVar1 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar1 == (DatabaseInterface *)0x0) {
      sVar4 = sVar4 * 8 + 0x160;
    }
    else {
      iVar3 = (*pDVar1->_vptr_DatabaseInterface[0xb])();
      sVar4 = sVar4 * 8 + CONCAT44(extraout_var,iVar3) + 0xb0;
    }
    puVar2 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (this->extra_readonly).
                  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1)
    {
      pDVar1 = (puVar6->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (pDVar1 == (DatabaseInterface *)0x0) {
        lVar5 = 0xb0;
      }
      else {
        iVar3 = (*pDVar1->_vptr_DatabaseInterface[0xb])();
        lVar5 = CONCAT44(extraout_var_00,iVar3);
      }
      sVar4 = sVar4 + lVar5;
    }
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

size_t compute_exported_metadata_size() const override
	{
		if (mode != DatabaseMode::ReadOnly)
			return 0;

		size_t size = 0;

		size += sizeof(ExportedMetadataHeader) + get_total_num_hashes() * sizeof(ExportedMetadataConcurrentPrimedBlock);

		if (readonly_interface)
			size += readonly_interface->compute_exported_metadata_size();
		else
			size += sizeof(ExportedMetadataHeader);

		for (auto &e : extra_readonly)
		{
			if (e)
				size += e->compute_exported_metadata_size();
			else
				size += sizeof(ExportedMetadataHeader);
		}

		return size;
	}